

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O2

void BZ2_compressBlock(EState *s,Bool is_last_block)

{
  UChar (*paUVar1) [258];
  Int32 (*paIVar2) [258];
  UChar UVar3;
  UChar UVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  UInt16 *pUVar56;
  int iVar57;
  uint v;
  long lVar58;
  long lVar59;
  Int32 (*paIVar60) [258];
  UInt32 *pUVar61;
  Int32 remF;
  uint uVar62;
  ushort *puVar63;
  UChar (*paUVar64) [258];
  Bool *pBVar65;
  ulong uVar66;
  ulong uVar67;
  UChar rtmp2;
  ulong uVar68;
  UChar UVar69;
  ulong uVar70;
  bool bVar71;
  int iVar72;
  uint uVar73;
  undefined7 in_register_00000031;
  ulong uVar74;
  int iVar75;
  uint uVar76;
  UChar *pUVar77;
  long lVar78;
  Bool *pBVar79;
  uint uVar80;
  ulong uVar81;
  UInt32 v_00;
  bool bVar82;
  long local_1b8;
  UInt16 cost [6];
  UChar local_168 [16];
  ulong local_158;
  undefined4 local_14c;
  Bool *local_148;
  UInt32 *local_140;
  Int32 fave [6];
  
  iVar72 = s->nblock;
  if (0 < iVar72) {
    uVar80 = s->blockCRC;
    s->blockCRC = ~uVar80;
    s->combinedCRC = (s->combinedCRC << 1 | (uint)((int)s->combinedCRC < 0)) ^ ~uVar80;
    if (1 < s->blockNo) {
      s->numZ = 0;
    }
    BZ2_blockSort(s);
    iVar72 = s->nblock;
  }
  s->zbits = (UChar *)((long)iVar72 + (long)s->arr2);
  if (s->blockNo == 1) {
    s->bsBuff = 0;
    s->bsLive = 0;
    bsPutUChar(s,'B');
    bsPutUChar(s,'Z');
    bsPutUChar(s,'h');
    bsPutUChar(s,(char)s->blockSize100k + '0');
    iVar72 = s->nblock;
  }
  if (iVar72 < 1) goto LAB_0010771e;
  bsPutUChar(s,'1');
  bsPutUChar(s,'A');
  bsPutUChar(s,'Y');
  bsPutUChar(s,'&');
  bsPutUChar(s,'S');
  bsPutUChar(s,'Y');
  bsPutUInt32(s,s->blockCRC);
  uVar80 = 0;
  bsW(s,1,0);
  bsW(s,0x18,s->origPtr);
  pUVar61 = s->ptr;
  pUVar77 = s->block;
  pUVar56 = s->mtfv;
  s->nInUse = 0;
  for (lVar58 = 0x80; lVar58 != 0x180; lVar58 = lVar58 + 1) {
    if (s->inUse[lVar58 + -0x80] != '\0') {
      s->inUse[lVar58 + 0x80] = (Bool)uVar80;
      uVar80 = uVar80 + 1;
      s->nInUse = uVar80;
    }
  }
  lVar59 = (long)(int)(uVar80 + 1);
  lVar58 = -1;
  lVar78 = lVar58;
  if (-1 < lVar59) {
    lVar78 = lVar59;
  }
  for (; lVar78 != lVar58; lVar58 = lVar58 + 1) {
    s->mtfFreq[lVar58 + 1] = 0;
  }
  uVar74 = 0;
  uVar70 = (ulong)uVar80;
  if ((int)uVar80 < 1) {
    uVar70 = uVar74;
  }
  for (; uVar70 != uVar74; uVar74 = uVar74 + 1) {
    *(char *)((long)fave + uVar74) = (char)uVar74;
  }
  local_14c = (int)CONCAT71(in_register_00000031,is_last_block);
  lVar58 = 0;
  iVar75 = 0;
  iVar72 = 0;
  while( true ) {
    UVar69 = fave[0]._1_1_;
    if (s->nblock <= lVar58) break;
    UVar3 = s->unseqToSeq
            [pUVar77[(int)(((int)(pUVar61[lVar58] - 1) >> 0x1f & s->nblock) + pUVar61[lVar58] + -1)]
            ];
    if ((UChar)fave[0] == UVar3) {
      iVar72 = iVar72 + 1;
    }
    else {
      if (0 < iVar72) {
        uVar73 = iVar72 - 1;
        puVar63 = pUVar56 + iVar75;
        while( true ) {
          iVar75 = iVar75 + 1;
          bVar82 = (uVar73 & 1) != 0;
          if (bVar82) {
            s->mtfFreq[1] = s->mtfFreq[1] + 1;
          }
          else {
            s->mtfFreq[0] = s->mtfFreq[0] + 1;
          }
          *puVar63 = (ushort)bVar82;
          if ((int)uVar73 < 2) break;
          uVar73 = uVar73 - 2 >> 1;
          puVar63 = puVar63 + 1;
        }
        iVar72 = 0;
      }
      fave[0]._1_1_ = (UChar)fave[0];
      lVar78 = 2;
      while (UVar3 != UVar69) {
        UVar4 = *(UChar *)((long)fave + lVar78);
        *(UChar *)((long)fave + lVar78) = UVar69;
        lVar78 = lVar78 + 1;
        UVar69 = UVar4;
      }
      fave[0]._0_1_ = UVar3;
      pUVar56[iVar75] = (UInt16)lVar78;
      iVar75 = iVar75 + 1;
      s->mtfFreq[(int)lVar78] = s->mtfFreq[(int)lVar78] + 1;
    }
    lVar58 = lVar58 + 1;
  }
  if (0 < iVar72) {
    uVar73 = iVar72 - 1;
    puVar63 = pUVar56 + iVar75;
    while( true ) {
      iVar75 = iVar75 + 1;
      bVar82 = (uVar73 & 1) != 0;
      if (bVar82) {
        s->mtfFreq[1] = s->mtfFreq[1] + 1;
      }
      else {
        s->mtfFreq[0] = s->mtfFreq[0] + 1;
      }
      *puVar63 = (ushort)bVar82;
      if ((int)uVar73 < 2) break;
      uVar73 = uVar73 - 2 >> 1;
      puVar63 = puVar63 + 1;
    }
  }
  pUVar56[iVar75] = (UInt16)(uVar80 + 1);
  s->mtfFreq[lVar59] = s->mtfFreq[lVar59] + 1;
  s->nMTF = iVar75 + 1;
  uVar74 = (ulong)s->nInUse;
  uVar80 = s->nInUse + 2;
  paUVar1 = s->len;
  lVar58 = 0;
  uVar70 = 0;
  paUVar64 = paUVar1;
  if (0 < (int)uVar80) {
    uVar70 = (ulong)uVar80;
  }
  for (; lVar58 != 6; lVar58 = lVar58 + 1) {
    for (uVar66 = 0; uVar70 != uVar66; uVar66 = uVar66 + 1) {
      (*paUVar64)[uVar66] = '\x0f';
    }
    paUVar64 = paUVar64 + 1;
  }
  uVar73 = s->nMTF;
  if ((int)uVar73 < 1) {
    bz_internal_error(0xbb9);
    uVar73 = s->nMTF;
  }
  iVar72 = 0;
  if ((int)uVar73 < 200) {
    v = 2;
LAB_0010651b:
    bVar82 = false;
  }
  else {
    if (uVar73 < 600) {
      v = 3;
      goto LAB_0010651b;
    }
    if (uVar73 < 0x4b0) {
      v = 4;
      goto LAB_0010651b;
    }
    bVar82 = 0x95f < uVar73;
    v = bVar82 + 5;
  }
  uVar81 = (ulong)v;
  pUVar77 = s->selectorMtf + uVar81 * 0x102 + 0x4550;
  uVar66 = uVar81;
  while (0 < (long)uVar66) {
    uVar67 = (ulong)(iVar72 + -1);
    lVar58 = uVar67 << 0x20;
    iVar75 = 0;
    for (; (iVar75 < (int)uVar73 / (int)uVar66 && ((long)uVar67 <= (long)uVar74));
        uVar67 = uVar67 + 1) {
      iVar75 = iVar75 + s->mtfFreq[uVar67 + 1];
      lVar58 = lVar58 + 0x100000000;
    }
    if (((iVar72 < (int)uVar67) && (uVar66 != 1 && uVar66 != uVar81)) &&
       ((v - (int)uVar66 & 0x80000001) == 1)) {
      iVar75 = iVar75 - *(int *)((long)s->mtfFreq + (lVar58 >> 0x1e));
      uVar67 = (ulong)((int)uVar67 - 1);
    }
    uVar66 = uVar66 - 1;
    for (uVar68 = 0; uVar70 != uVar68; uVar68 = uVar68 + 1) {
      UVar69 = '\0';
      if ((long)(int)uVar67 < (long)uVar68) {
        UVar69 = '\x0f';
      }
      if ((long)uVar68 < (long)iVar72) {
        UVar69 = '\x0f';
      }
      pUVar77[uVar68] = UVar69;
    }
    iVar72 = (int)uVar67 + 1;
    uVar73 = uVar73 - iVar75;
    pUVar77 = pUVar77 + -0x102;
  }
  local_148 = s->inUse;
  paIVar2 = s->rfreq;
  local_140 = s->len_pack[0] + 2;
  uVar66 = 0;
  while ((int)uVar66 != 4) {
    local_158 = uVar66;
    for (uVar74 = 0; uVar81 != uVar74; uVar74 = uVar74 + 1) {
      fave[uVar74] = 0;
    }
    paIVar60 = paIVar2;
    for (uVar74 = 0; uVar74 != uVar81; uVar74 = uVar74 + 1) {
      for (uVar66 = 0; uVar70 != uVar66; uVar66 = uVar66 + 1) {
        (*paIVar60)[uVar66] = 0;
      }
      paIVar60 = paIVar60 + 1;
    }
    if (bVar82) {
      pUVar61 = local_140;
      for (uVar74 = 0; uVar70 != uVar74; uVar74 = uVar74 + 1) {
        (*(UInt32 (*) [4])(pUVar61 + -2))[0] =
             (uint)s->len[0][uVar74] | (uint)s->len[1][uVar74] << 0x10;
        pUVar61[-1] = (uint)s->len[2][uVar74] | (uint)s->len[3][uVar74] << 0x10;
        *pUVar61 = (uint)s->len[4][uVar74] | (uint)s->len[5][uVar74] << 0x10;
        pUVar61 = pUVar61 + 4;
      }
    }
    uVar74 = 0;
    iVar72 = 0;
    while (iVar75 = s->nMTF, uVar66 = uVar81, paIVar60 = paIVar2, paUVar64 = paUVar1,
          iVar72 < iVar75) {
      for (uVar66 = 0; uVar81 != uVar66; uVar66 = uVar66 + 1) {
        cost[uVar66] = 0;
      }
      iVar57 = iVar75 + -1;
      if (iVar72 + 0x31 < iVar75) {
        iVar57 = iVar72 + 0x31;
      }
      lVar78 = (long)iVar72;
      bVar71 = (bool)(iVar57 - iVar72 == 0x31 & bVar82);
      lVar58 = lVar78;
      if (bVar71) {
        uVar6 = pUVar56[lVar78];
        uVar7 = pUVar56[lVar78 + 1];
        uVar8 = pUVar56[lVar78 + 2];
        uVar9 = pUVar56[lVar78 + 3];
        uVar10 = pUVar56[lVar78 + 4];
        uVar11 = pUVar56[lVar78 + 5];
        uVar12 = pUVar56[lVar78 + 6];
        uVar13 = pUVar56[lVar78 + 7];
        uVar14 = pUVar56[lVar78 + 8];
        uVar15 = pUVar56[lVar78 + 9];
        uVar16 = pUVar56[lVar78 + 10];
        uVar17 = pUVar56[lVar78 + 0xb];
        uVar18 = pUVar56[lVar78 + 0xc];
        uVar19 = pUVar56[lVar78 + 0xd];
        uVar20 = pUVar56[lVar78 + 0xe];
        uVar21 = pUVar56[lVar78 + 0xf];
        uVar22 = pUVar56[lVar78 + 0x10];
        uVar23 = pUVar56[lVar78 + 0x11];
        uVar24 = pUVar56[lVar78 + 0x12];
        uVar25 = pUVar56[lVar78 + 0x13];
        uVar26 = pUVar56[lVar78 + 0x14];
        uVar27 = pUVar56[lVar78 + 0x15];
        uVar28 = pUVar56[lVar78 + 0x16];
        uVar29 = pUVar56[lVar78 + 0x17];
        uVar30 = pUVar56[lVar78 + 0x18];
        uVar31 = pUVar56[lVar78 + 0x19];
        uVar32 = pUVar56[lVar78 + 0x1a];
        uVar33 = pUVar56[lVar78 + 0x1b];
        uVar34 = pUVar56[lVar78 + 0x1c];
        uVar35 = pUVar56[lVar78 + 0x1d];
        uVar36 = pUVar56[lVar78 + 0x1e];
        uVar37 = pUVar56[lVar78 + 0x1f];
        uVar38 = pUVar56[lVar78 + 0x20];
        uVar39 = pUVar56[lVar78 + 0x21];
        uVar40 = pUVar56[lVar78 + 0x22];
        uVar41 = pUVar56[lVar78 + 0x23];
        uVar42 = pUVar56[lVar78 + 0x24];
        uVar43 = pUVar56[lVar78 + 0x25];
        uVar44 = pUVar56[lVar78 + 0x26];
        uVar45 = pUVar56[lVar78 + 0x27];
        uVar46 = pUVar56[lVar78 + 0x28];
        uVar47 = pUVar56[lVar78 + 0x29];
        uVar48 = pUVar56[lVar78 + 0x2a];
        uVar49 = pUVar56[lVar78 + 0x2b];
        uVar50 = pUVar56[lVar78 + 0x2c];
        uVar51 = pUVar56[lVar78 + 0x2d];
        uVar52 = pUVar56[lVar78 + 0x2e];
        uVar53 = pUVar56[lVar78 + 0x2f];
        uVar54 = pUVar56[lVar78 + 0x30];
        uVar55 = pUVar56[lVar78 + 0x31];
        cost._0_4_ = s->len_pack[uVar7][0] + s->len_pack[uVar6][0] + s->len_pack[uVar8][0] +
                     s->len_pack[uVar9][0] + s->len_pack[uVar10][0] + s->len_pack[uVar11][0] +
                     s->len_pack[uVar12][0] + s->len_pack[uVar13][0] + s->len_pack[uVar14][0] +
                     s->len_pack[uVar15][0] + s->len_pack[uVar16][0] + s->len_pack[uVar17][0] +
                     s->len_pack[uVar18][0] + s->len_pack[uVar19][0] + s->len_pack[uVar20][0] +
                     s->len_pack[uVar21][0] + s->len_pack[uVar22][0] + s->len_pack[uVar23][0] +
                     s->len_pack[uVar24][0] + s->len_pack[uVar25][0] + s->len_pack[uVar26][0] +
                     s->len_pack[uVar27][0] + s->len_pack[uVar28][0] + s->len_pack[uVar29][0] +
                     s->len_pack[uVar30][0] + s->len_pack[uVar31][0] + s->len_pack[uVar32][0] +
                     s->len_pack[uVar33][0] + s->len_pack[uVar34][0] + s->len_pack[uVar35][0] +
                     s->len_pack[uVar36][0] + s->len_pack[uVar37][0] + s->len_pack[uVar38][0] +
                     s->len_pack[uVar39][0] + s->len_pack[uVar40][0] + s->len_pack[uVar41][0] +
                     s->len_pack[uVar42][0] + s->len_pack[uVar43][0] + s->len_pack[uVar44][0] +
                     s->len_pack[uVar45][0] + s->len_pack[uVar46][0] + s->len_pack[uVar47][0] +
                     s->len_pack[uVar48][0] + s->len_pack[uVar49][0] + s->len_pack[uVar50][0] +
                     s->len_pack[uVar51][0] + s->len_pack[uVar52][0] + s->len_pack[uVar53][0] +
                     s->len_pack[uVar54][0] + s->len_pack[uVar55][0];
        cost._4_4_ = s->len_pack[uVar7][1] + s->len_pack[uVar6][1] + s->len_pack[uVar8][1] +
                     s->len_pack[uVar9][1] + s->len_pack[uVar10][1] + s->len_pack[uVar11][1] +
                     s->len_pack[uVar12][1] + s->len_pack[uVar13][1] + s->len_pack[uVar14][1] +
                     s->len_pack[uVar15][1] + s->len_pack[uVar16][1] + s->len_pack[uVar17][1] +
                     s->len_pack[uVar18][1] + s->len_pack[uVar19][1] + s->len_pack[uVar20][1] +
                     s->len_pack[uVar21][1] + s->len_pack[uVar22][1] + s->len_pack[uVar23][1] +
                     s->len_pack[uVar24][1] + s->len_pack[uVar25][1] + s->len_pack[uVar26][1] +
                     s->len_pack[uVar27][1] + s->len_pack[uVar28][1] + s->len_pack[uVar29][1] +
                     s->len_pack[uVar30][1] + s->len_pack[uVar31][1] + s->len_pack[uVar32][1] +
                     s->len_pack[uVar33][1] + s->len_pack[uVar34][1] + s->len_pack[uVar35][1] +
                     s->len_pack[uVar36][1] + s->len_pack[uVar37][1] + s->len_pack[uVar38][1] +
                     s->len_pack[uVar39][1] + s->len_pack[uVar40][1] + s->len_pack[uVar41][1] +
                     s->len_pack[uVar42][1] + s->len_pack[uVar43][1] + s->len_pack[uVar44][1] +
                     s->len_pack[uVar45][1] + s->len_pack[uVar46][1] + s->len_pack[uVar47][1] +
                     s->len_pack[uVar48][1] + s->len_pack[uVar49][1] + s->len_pack[uVar50][1] +
                     s->len_pack[uVar51][1] + s->len_pack[uVar52][1] + s->len_pack[uVar53][1] +
                     s->len_pack[uVar54][1] + s->len_pack[uVar55][1];
        cost._8_4_ = s->len_pack[uVar7][2] + s->len_pack[uVar6][2] + s->len_pack[uVar8][2] +
                     s->len_pack[uVar9][2] + s->len_pack[uVar10][2] + s->len_pack[uVar11][2] +
                     s->len_pack[uVar12][2] + s->len_pack[uVar13][2] + s->len_pack[uVar14][2] +
                     s->len_pack[uVar15][2] + s->len_pack[uVar16][2] + s->len_pack[uVar17][2] +
                     s->len_pack[uVar18][2] + s->len_pack[uVar19][2] + s->len_pack[uVar20][2] +
                     s->len_pack[uVar21][2] + s->len_pack[uVar22][2] + s->len_pack[uVar23][2] +
                     s->len_pack[uVar24][2] + s->len_pack[uVar25][2] + s->len_pack[uVar26][2] +
                     s->len_pack[uVar27][2] + s->len_pack[uVar28][2] + s->len_pack[uVar29][2] +
                     s->len_pack[uVar30][2] + s->len_pack[uVar31][2] + s->len_pack[uVar32][2] +
                     s->len_pack[uVar33][2] + s->len_pack[uVar34][2] + s->len_pack[uVar35][2] +
                     s->len_pack[uVar36][2] + s->len_pack[uVar37][2] + s->len_pack[uVar38][2] +
                     s->len_pack[uVar39][2] + s->len_pack[uVar40][2] + s->len_pack[uVar41][2] +
                     s->len_pack[uVar42][2] + s->len_pack[uVar43][2] + s->len_pack[uVar44][2] +
                     s->len_pack[uVar45][2] + s->len_pack[uVar46][2] + s->len_pack[uVar47][2] +
                     s->len_pack[uVar48][2] + s->len_pack[uVar49][2] + s->len_pack[uVar50][2] +
                     s->len_pack[uVar51][2] + s->len_pack[uVar52][2] + s->len_pack[uVar53][2] +
                     s->len_pack[uVar54][2] + s->len_pack[uVar55][2];
      }
      else {
        for (; lVar58 <= iVar57; lVar58 = lVar58 + 1) {
          pUVar77 = s->len[0] + pUVar56[lVar58];
          for (uVar66 = 0; uVar81 != uVar66; uVar66 = uVar66 + 1) {
            cost[uVar66] = cost[uVar66] + (ushort)*pUVar77;
            pUVar77 = pUVar77 + 0x102;
          }
        }
      }
      uVar66 = 0xffffffffffffffff;
      uVar73 = 999999999;
      for (uVar67 = 0; uVar81 != uVar67; uVar67 = uVar67 + 1) {
        uVar6 = cost[uVar67];
        uVar76 = uVar73;
        if (uVar6 <= uVar73) {
          uVar76 = (uint)uVar6;
        }
        if (uVar6 < uVar73) {
          uVar66 = uVar67;
        }
        uVar66 = uVar66 & 0xffffffff;
        uVar73 = uVar76;
      }
      iVar72 = (int)uVar66;
      fave[iVar72] = fave[iVar72] + 1;
      s->selector[uVar74] = (UChar)uVar66;
      if (bVar71) {
        paIVar2[iVar72][pUVar56[lVar78]] = paIVar2[iVar72][pUVar56[lVar78]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 1]] = paIVar2[iVar72][pUVar56[lVar78 + 1]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 2]] = paIVar2[iVar72][pUVar56[lVar78 + 2]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 3]] = paIVar2[iVar72][pUVar56[lVar78 + 3]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 4]] = paIVar2[iVar72][pUVar56[lVar78 + 4]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 5]] = paIVar2[iVar72][pUVar56[lVar78 + 5]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 6]] = paIVar2[iVar72][pUVar56[lVar78 + 6]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 7]] = paIVar2[iVar72][pUVar56[lVar78 + 7]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 8]] = paIVar2[iVar72][pUVar56[lVar78 + 8]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 9]] = paIVar2[iVar72][pUVar56[lVar78 + 9]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 10]] = paIVar2[iVar72][pUVar56[lVar78 + 10]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0xb]] = paIVar2[iVar72][pUVar56[lVar78 + 0xb]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0xc]] = paIVar2[iVar72][pUVar56[lVar78 + 0xc]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0xd]] = paIVar2[iVar72][pUVar56[lVar78 + 0xd]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0xe]] = paIVar2[iVar72][pUVar56[lVar78 + 0xe]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0xf]] = paIVar2[iVar72][pUVar56[lVar78 + 0xf]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x10]] = paIVar2[iVar72][pUVar56[lVar78 + 0x10]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x11]] = paIVar2[iVar72][pUVar56[lVar78 + 0x11]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x12]] = paIVar2[iVar72][pUVar56[lVar78 + 0x12]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x13]] = paIVar2[iVar72][pUVar56[lVar78 + 0x13]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x14]] = paIVar2[iVar72][pUVar56[lVar78 + 0x14]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x15]] = paIVar2[iVar72][pUVar56[lVar78 + 0x15]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x16]] = paIVar2[iVar72][pUVar56[lVar78 + 0x16]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x17]] = paIVar2[iVar72][pUVar56[lVar78 + 0x17]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x18]] = paIVar2[iVar72][pUVar56[lVar78 + 0x18]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x19]] = paIVar2[iVar72][pUVar56[lVar78 + 0x19]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x1a]] = paIVar2[iVar72][pUVar56[lVar78 + 0x1a]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x1b]] = paIVar2[iVar72][pUVar56[lVar78 + 0x1b]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x1c]] = paIVar2[iVar72][pUVar56[lVar78 + 0x1c]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x1d]] = paIVar2[iVar72][pUVar56[lVar78 + 0x1d]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x1e]] = paIVar2[iVar72][pUVar56[lVar78 + 0x1e]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x1f]] = paIVar2[iVar72][pUVar56[lVar78 + 0x1f]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x20]] = paIVar2[iVar72][pUVar56[lVar78 + 0x20]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x21]] = paIVar2[iVar72][pUVar56[lVar78 + 0x21]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x22]] = paIVar2[iVar72][pUVar56[lVar78 + 0x22]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x23]] = paIVar2[iVar72][pUVar56[lVar78 + 0x23]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x24]] = paIVar2[iVar72][pUVar56[lVar78 + 0x24]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x25]] = paIVar2[iVar72][pUVar56[lVar78 + 0x25]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x26]] = paIVar2[iVar72][pUVar56[lVar78 + 0x26]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x27]] = paIVar2[iVar72][pUVar56[lVar78 + 0x27]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x28]] = paIVar2[iVar72][pUVar56[lVar78 + 0x28]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x29]] = paIVar2[iVar72][pUVar56[lVar78 + 0x29]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x2a]] = paIVar2[iVar72][pUVar56[lVar78 + 0x2a]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x2b]] = paIVar2[iVar72][pUVar56[lVar78 + 0x2b]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x2c]] = paIVar2[iVar72][pUVar56[lVar78 + 0x2c]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x2d]] = paIVar2[iVar72][pUVar56[lVar78 + 0x2d]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x2e]] = paIVar2[iVar72][pUVar56[lVar78 + 0x2e]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x2f]] = paIVar2[iVar72][pUVar56[lVar78 + 0x2f]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x30]] = paIVar2[iVar72][pUVar56[lVar78 + 0x30]] + 1;
        paIVar2[iVar72][pUVar56[lVar78 + 0x31]] = paIVar2[iVar72][pUVar56[lVar78 + 0x31]] + 1;
      }
      else {
        for (; lVar78 <= iVar57; lVar78 = lVar78 + 1) {
          paIVar2[iVar72][pUVar56[lVar78]] = paIVar2[iVar72][pUVar56[lVar78]] + 1;
        }
      }
      uVar74 = uVar74 + 1;
      iVar72 = iVar57 + 1;
    }
    while (uVar66 != 0) {
      BZ2_hbMakeCodeLengths(*paUVar64,*paIVar60,uVar80,0x11);
      uVar66 = uVar66 - 1;
      paIVar60 = paIVar60 + 1;
      paUVar64 = paUVar64 + 1;
    }
    uVar66 = (ulong)((int)local_158 + 1);
  }
  v_00 = (UInt32)uVar74;
  if (0x4652 < (int)v_00) {
    bz_internal_error(0xbbb);
  }
  for (uVar66 = 0; uVar81 != uVar66; uVar66 = uVar66 + 1) {
    local_168[uVar66] = (UChar)uVar66;
  }
  uVar66 = 0;
  uVar67 = 0;
  if (0 < (int)v_00) {
    uVar67 = uVar74 & 0xffffffff;
  }
  for (; uVar66 != uVar67; uVar66 = uVar66 + 1) {
    UVar69 = s->selector[uVar66];
    lVar58 = 0;
    while (UVar69 != local_168[0]) {
      UVar3 = local_168[lVar58 + 1];
      local_168[lVar58 + 1] = local_168[0];
      lVar58 = lVar58 + 1;
      local_168[0] = UVar3;
    }
    s->selectorMtf[uVar66] = (UChar)lVar58;
    local_168[0] = UVar69;
  }
  paUVar64 = paUVar1;
  for (uVar74 = 0; pBVar79 = local_148, uVar66 = 0, pBVar65 = local_148, uVar74 != uVar81;
      uVar74 = uVar74 + 1) {
    uVar76 = 0;
    uVar73 = 0x20;
    for (; uVar70 != uVar66; uVar66 = uVar66 + 1) {
      uVar62 = (uint)(*paUVar64)[uVar66];
      if (uVar76 <= (*paUVar64)[uVar66]) {
        uVar76 = uVar62;
      }
      if (uVar62 <= uVar73) {
        uVar73 = uVar62;
      }
    }
    if (0x11 < uVar76) {
      bz_internal_error(0xbbc);
    }
    if (uVar73 == 0) {
      bz_internal_error(0xbbd);
    }
    BZ2_hbAssignCodes(s->code[uVar74],paUVar1[uVar74],uVar73,uVar76,uVar80);
    paUVar64 = paUVar64 + 1;
  }
  for (; uVar66 != 0x10; uVar66 = uVar66 + 1) {
    local_168[uVar66] = '\0';
    for (lVar58 = 0; lVar58 != 0x10; lVar58 = lVar58 + 1) {
      if (pBVar65[lVar58] != '\0') {
        local_168[uVar66] = '\x01';
      }
    }
    pBVar65 = pBVar65 + 0x10;
  }
  for (lVar58 = 0; lVar58 != 0x10; lVar58 = lVar58 + 1) {
    bsW(s,1,(uint)(local_168[lVar58] != '\0'));
  }
  for (lVar58 = 0; lVar58 != 0x10; lVar58 = lVar58 + 1) {
    if (local_168[lVar58] != '\0') {
      for (lVar78 = 0; lVar78 != 0x10; lVar78 = lVar78 + 1) {
        bsW(s,1,(uint)(pBVar79[lVar78] != '\0'));
      }
    }
    pBVar79 = pBVar79 + 0x10;
  }
  bsW(s,3,v);
  bsW(s,0xf,v_00);
  for (uVar74 = 0; uVar74 != uVar67; uVar74 = uVar74 + 1) {
    for (uVar80 = 0; uVar80 < s->selectorMtf[uVar74]; uVar80 = uVar80 + 1) {
      bsW(s,1,1);
    }
    bsW(s,1,0);
  }
  uVar74 = 0;
  while (uVar74 != uVar81) {
    uVar80 = (uint)paUVar1[uVar74][0];
    local_158 = uVar74;
    bsW(s,5,uVar80);
    for (uVar66 = 0; uVar66 != uVar70; uVar66 = uVar66 + 1) {
      for (; bVar5 = paUVar1[uVar74][uVar66], (int)uVar80 < (int)(uint)bVar5; uVar80 = uVar80 + 1) {
        bsW(s,2,2);
      }
      while (bVar5 < uVar80) {
        bsW(s,2,3);
        uVar80 = uVar80 - 1;
        bVar5 = paUVar1[uVar74][uVar66];
      }
      bsW(s,1,0);
    }
    uVar74 = local_158 + 1;
  }
  local_1b8 = 0;
  iVar72 = 0;
  while (iVar75 = s->nMTF, iVar72 < iVar75) {
    iVar57 = iVar75 + -1;
    if (iVar72 + 0x31 < iVar75) {
      iVar57 = iVar72 + 0x31;
    }
    if (v <= s->selector[local_1b8]) {
      bz_internal_error(0xbbe);
    }
    if ((bool)(bVar82 & iVar57 - iVar72 == 0x31)) {
      bVar5 = s->selector[local_1b8];
      bsW(s,(uint)paUVar1[bVar5][pUVar56[iVar72]],s->code[bVar5][pUVar56[iVar72]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 1]],
          s->code[bVar5][pUVar56[(long)iVar72 + 1]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 2]],
          s->code[bVar5][pUVar56[(long)iVar72 + 2]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 3]],
          s->code[bVar5][pUVar56[(long)iVar72 + 3]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 4]],
          s->code[bVar5][pUVar56[(long)iVar72 + 4]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 5]],
          s->code[bVar5][pUVar56[(long)iVar72 + 5]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 6]],
          s->code[bVar5][pUVar56[(long)iVar72 + 6]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 7]],
          s->code[bVar5][pUVar56[(long)iVar72 + 7]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 8]],
          s->code[bVar5][pUVar56[(long)iVar72 + 8]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 9]],
          s->code[bVar5][pUVar56[(long)iVar72 + 9]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 10]],
          s->code[bVar5][pUVar56[(long)iVar72 + 10]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0xb]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0xb]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0xc]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0xc]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0xd]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0xd]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0xe]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0xe]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0xf]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0xf]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x10]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x10]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x11]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x11]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x12]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x12]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x13]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x13]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x14]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x14]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x15]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x15]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x16]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x16]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x17]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x17]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x18]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x18]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x19]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x19]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x1a]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x1a]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x1b]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x1b]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x1c]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x1c]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x1d]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x1d]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x1e]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x1e]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x1f]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x1f]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x20]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x20]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x21]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x21]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x22]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x22]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x23]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x23]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x24]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x24]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x25]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x25]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x26]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x26]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x27]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x27]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x28]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x28]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x29]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x29]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x2a]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x2a]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x2b]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x2b]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x2c]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x2c]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x2d]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x2d]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x2e]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x2e]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x2f]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x2f]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x30]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x30]]);
      bsW(s,(uint)paUVar1[bVar5][pUVar56[(long)iVar72 + 0x31]],
          s->code[bVar5][pUVar56[(long)iVar72 + 0x31]]);
    }
    else {
      for (lVar58 = (long)iVar72; lVar58 <= iVar57; lVar58 = lVar58 + 1) {
        bsW(s,(uint)paUVar1[s->selector[local_1b8]][pUVar56[lVar58]],
            s->code[s->selector[local_1b8]][pUVar56[lVar58]]);
      }
    }
    local_1b8 = local_1b8 + 1;
    iVar72 = iVar57 + 1;
  }
  if (v_00 != (UInt32)local_1b8) {
    bz_internal_error(0xbbf);
  }
  is_last_block = (Bool)local_14c;
LAB_0010771e:
  if (is_last_block != '\0') {
    bsPutUChar(s,'\x17');
    bsPutUChar(s,'r');
    bsPutUChar(s,'E');
    bsPutUChar(s,'8');
    bsPutUChar(s,'P');
    bsPutUChar(s,0x90);
    bsPutUInt32(s,s->combinedCRC);
    iVar72 = s->bsLive;
    while (0 < iVar72) {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar72 = s->bsLive + -8;
      s->bsLive = iVar72;
    }
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*-- 
         Now a single bit indicating (non-)randomisation. 
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}